

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

SiameseResult __thiscall
siamese::Encoder::GetStatistics(Encoder *this,uint64_t *statsOut,uint statsCount)

{
  uint i;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 9;
  if (statsCount < 9) {
    uVar3 = (ulong)statsCount;
  }
  uVar1 = pktalloc::Allocator::GetMemoryAllocatedBytes(&this->TheAllocator);
  (this->Stats).Counts[8] = (ulong)uVar1;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    statsOut[uVar2] = (this->Stats).Counts[uVar2];
  }
  return Siamese_Success;
}

Assistant:

SiameseResult Encoder::GetStatistics(uint64_t* statsOut, unsigned statsCount)
{
    if (statsCount > SiameseEncoderStats_Count)
        statsCount = SiameseEncoderStats_Count;

    // Fill in memory allocated
    Stats.Counts[SiameseEncoderStats_MemoryUsed] = TheAllocator.GetMemoryAllocatedBytes();

    for (unsigned i = 0; i < statsCount; ++i)
        statsOut[i] = Stats.Counts[i];

    return Siamese_Success;
}